

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::print_const_value
          (t_dart_generator *this,ostream *out,string *name,t_type *type,t_const_value *value,
          bool in_static,bool defval)

{
  char *pcVar1;
  __type _Var2;
  bool bVar3;
  ulong uVar4;
  int64_t iVar5;
  reference pptVar6;
  string *psVar7;
  t_type *ptVar8;
  t_type *type_00;
  pointer ppVar9;
  ostream *poVar10;
  reference pptVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  string local_3f8;
  undefined1 local_3d8 [8];
  string val_5;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_3a8;
  const_iterator v_iter_2;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_4;
  t_type *local_378;
  t_type *etype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  undefined1 local_310 [8];
  string val_3;
  undefined1 local_2d0 [8];
  string key;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_2a0;
  const_iterator v_iter_1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_2;
  t_type *vtype;
  t_type *ktype;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  string val_1;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_150
  ;
  t_field **local_148;
  t_type *local_140;
  t_type *field_type;
  _Base_ptr local_130;
  string local_128;
  string local_108;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_e8;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_a8;
  undefined1 local_88 [8];
  string v2;
  string local_58;
  byte local_32;
  byte local_31;
  bool defval_local;
  t_const_value *ptStack_30;
  bool in_static_local;
  t_const_value *value_local;
  t_type *type_local;
  string *name_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  local_32 = defval;
  local_31 = in_static;
  ptStack_30 = value;
  value_local = (t_const_value *)type;
  type_local = (t_type *)name;
  name_local = (string *)out;
  out_local = (ostream *)this;
  value_local = (t_const_value *)t_generator::get_true_type(type);
  t_generator::indent((t_generator *)this,(ostream *)name_local);
  if ((local_32 & 1) == 0) {
    pcVar1 = "public static final ";
    if ((local_31 & 1) != 0) {
      pcVar1 = "public var ";
    }
    std::operator<<((ostream *)name_local,pcVar1 + 7);
  }
  uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x28))();
  psVar7 = name_local;
  if ((uVar4 & 1) == 0) {
    uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x50))();
    psVar7 = name_local;
    if ((uVar4 & 1) == 0) {
      uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x58))();
      if (((uVar4 & 1) == 0) &&
         (uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x60))(),
         (uVar4 & 1) == 0)) {
        uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x80))();
        psVar7 = name_local;
        if ((uVar4 & 1) == 0) {
          uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x70))();
          if (((uVar4 & 1) == 0) &&
             (uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x78))(),
             (uVar4 & 1) == 0)) {
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x18))();
            std::operator+(pbVar12,"compiler error: no const of type ",pbVar13);
            __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          psVar7 = name_local;
          if ((local_32 & 1) == 0) {
            type_name_abi_cxx11_((string *)&etype,this,(t_type *)value_local);
            poVar10 = std::operator<<((ostream *)psVar7,(string *)&etype);
            std::operator<<(poVar10," ");
            std::__cxx11::string::~string((string *)&etype);
          }
          poVar10 = std::operator<<((ostream *)name_local,(string *)name);
          std::operator<<(poVar10," = ");
          uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x70))();
          if ((uVar4 & 1) == 0) {
            poVar10 = std::operator<<((ostream *)name_local,"new ");
            type_name_abi_cxx11_((string *)&val_4,this,(t_type *)value_local);
            poVar10 = std::operator<<(poVar10,(string *)&val_4);
            poVar10 = std::operator<<(poVar10,".from([");
            std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&val_4);
            local_378 = t_set::get_elem_type((t_set *)value_local);
          }
          else {
            poVar10 = std::operator<<((ostream *)name_local,"[");
            std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
            local_378 = t_list::get_elem_type((t_list *)value_local);
          }
          v_iter_2._M_current = (t_const_value **)t_const_value::get_list(ptStack_30);
          __gnu_cxx::
          __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
          ::__normal_iterator(&local_3a8);
          t_generator::indent_up((t_generator *)this);
          local_3a8._M_current =
               (t_const_value **)
               std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                         (v_iter_2._M_current);
          while( true ) {
            val_5.field_2._8_8_ =
                 std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                           ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                            v_iter_2._M_current);
            bVar3 = __gnu_cxx::operator!=
                              (&local_3a8,
                               (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                *)((long)&val_5.field_2 + 8));
            psVar7 = name_local;
            if (!bVar3) break;
            std::__cxx11::string::string((string *)&local_3f8,(string *)name);
            ptVar8 = local_378;
            pptVar11 = __gnu_cxx::
                       __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                       ::operator*(&local_3a8);
            render_const_value((string *)local_3d8,this,(ostream *)psVar7,&local_3f8,ptVar8,
                               *pptVar11);
            std::__cxx11::string::~string((string *)&local_3f8);
            poVar10 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar10 = std::operator<<(poVar10,(string *)local_3d8);
            poVar10 = std::operator<<(poVar10,",");
            std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_3d8);
            __gnu_cxx::
            __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
            ::operator++(&local_3a8);
          }
          t_generator::indent_down((t_generator *)this);
          uVar4 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x70))();
          if ((uVar4 & 1) == 0) {
            poVar10 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar10 = std::operator<<(poVar10,"]);");
            std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
          }
          else {
            poVar10 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar10 = std::operator<<(poVar10,"];");
            std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
          }
        }
        else {
          if ((local_32 & 1) == 0) {
            type_name_abi_cxx11_(&local_258,this,(t_type *)value_local);
            poVar10 = std::operator<<((ostream *)psVar7,(string *)&local_258);
            std::operator<<(poVar10," ");
            std::__cxx11::string::~string((string *)&local_258);
          }
          poVar10 = std::operator<<((ostream *)name_local,(string *)name);
          std::operator<<(poVar10," =");
          psVar7 = name_local;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_278," ",(allocator *)((long)&ktype + 7));
          scope_up(this,(ostream *)psVar7,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ktype + 7));
          ptVar8 = t_map::get_key_type((t_map *)value_local);
          type_00 = t_map::get_val_type((t_map *)value_local);
          v_iter_1._M_node = (_Base_ptr)t_const_value::get_map(ptStack_30);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_2a0);
          local_2a0._M_node =
               (_Base_ptr)
               std::
               map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               ::begin(v_iter_1._M_node);
          while( true ) {
            key.field_2._8_8_ =
                 std::
                 map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        *)v_iter_1._M_node);
            bVar3 = std::operator!=(&local_2a0,(_Self *)((long)&key.field_2 + 8));
            psVar7 = name_local;
            if (!bVar3) break;
            std::__cxx11::string::string((string *)(val_3.field_2._M_local_buf + 8),(string *)name);
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_2a0);
            render_const_value((string *)local_2d0,this,(ostream *)psVar7,
                               (string *)(val_3.field_2._M_local_buf + 8),ptVar8,ppVar9->first);
            std::__cxx11::string::~string((string *)(val_3.field_2._M_local_buf + 8));
            psVar7 = name_local;
            std::__cxx11::string::string((string *)&local_330,(string *)name);
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_2a0);
            render_const_value((string *)local_310,this,(ostream *)psVar7,&local_330,type_00,
                               ppVar9->second);
            std::__cxx11::string::~string((string *)&local_330);
            poVar10 = t_generator::indent((t_generator *)this,(ostream *)name_local);
            poVar10 = std::operator<<(poVar10,(string *)local_2d0);
            poVar10 = std::operator<<(poVar10,": ");
            poVar10 = std::operator<<(poVar10,(string *)local_310);
            poVar10 = std::operator<<(poVar10,",");
            std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)local_310);
            std::__cxx11::string::~string((string *)local_2d0);
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_2a0);
          }
          std::operator+(&local_350,";",&::endl_abi_cxx11_);
          scope_down(this,(ostream *)psVar7,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          std::operator<<((ostream *)name_local,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        f_iter._M_current = (t_field **)t_struct::get_members((t_struct *)value_local);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&val);
        v_iter._M_node = (_Base_ptr)t_const_value::get_map(ptStack_30);
        std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
        _Rb_tree_const_iterator(&local_e8);
        psVar7 = name_local;
        type_name_abi_cxx11_(&local_108,this,(t_type *)value_local);
        poVar10 = std::operator<<((ostream *)psVar7,(string *)&local_108);
        poVar10 = std::operator<<(poVar10," ");
        poVar10 = std::operator<<(poVar10,(string *)name);
        poVar10 = std::operator<<(poVar10," = new ");
        type_name_abi_cxx11_(&local_128,this,(t_type *)value_local);
        poVar10 = std::operator<<(poVar10,(string *)&local_128);
        std::operator<<(poVar10,"()");
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_108);
        t_generator::indent_up((t_generator *)this);
        local_130 = (_Base_ptr)
                    std::
                    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    ::begin(v_iter._M_node);
        local_e8._M_node = local_130;
        while( true ) {
          field_type = (t_type *)
                       std::
                       map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                       ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                              *)v_iter._M_node);
          bVar3 = std::operator!=(&local_e8,(_Self *)&field_type);
          if (!bVar3) break;
          local_140 = (t_type *)0x0;
          local_148 = (t_field **)
                      std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
          val = (map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 *)local_148;
          while( true ) {
            local_150._M_current =
                 (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&val,&local_150);
            psVar7 = name_local;
            if (!bVar3) break;
            pptVar6 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                   *)&val);
            psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_e8);
            t_const_value::get_string_abi_cxx11_(&local_170,ppVar9->first);
            _Var2 = std::operator==(psVar7,&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            if (_Var2) {
              pptVar6 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&val);
              local_140 = t_field::get_type(*pptVar6);
            }
            __gnu_cxx::
            __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
            ::operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&val);
          }
          if (local_140 == (t_type *)0x0) {
            val_1.field_2._M_local_buf[0xf] = '\x01';
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x18))();
            std::operator+(&local_1b0,"type error: ",pbVar13);
            std::operator+(&local_190,&local_1b0," has no field ");
            ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                     ::operator->(&local_e8);
            t_const_value::get_string_abi_cxx11_(&local_1d0,ppVar9->first);
            std::operator+(pbVar12,&local_190,&local_1d0);
            val_1.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::__cxx11::string::string((string *)&local_218,(string *)name);
          ptVar8 = local_140;
          ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                   operator->(&local_e8);
          render_const_value((string *)local_1f8,this,(ostream *)psVar7,&local_218,ptVar8,
                             ppVar9->second);
          std::__cxx11::string::~string((string *)&local_218);
          std::operator<<((ostream *)name_local,(string *)&::endl_abi_cxx11_);
          poVar10 = t_generator::indent((t_generator *)this,(ostream *)name_local);
          poVar10 = std::operator<<(poVar10,"..");
          ppVar9 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                   operator->(&local_e8);
          t_const_value::get_string_abi_cxx11_(&local_238,ppVar9->first);
          poVar10 = std::operator<<(poVar10,(string *)&local_238);
          poVar10 = std::operator<<(poVar10," = ");
          std::operator<<(poVar10,(string *)local_1f8);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)local_1f8);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          operator++(&local_e8);
        }
        t_generator::indent_down((t_generator *)this);
        poVar10 = std::operator<<((ostream *)name_local,";");
        std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      if ((local_32 & 1) == 0) {
        type_name_abi_cxx11_((string *)&fields,this,(t_type *)value_local);
        poVar10 = std::operator<<((ostream *)psVar7,(string *)&fields);
        std::operator<<(poVar10," ");
        std::__cxx11::string::~string((string *)&fields);
      }
      std::operator<<((ostream *)name_local,(string *)name);
      poVar10 = std::operator<<((ostream *)name_local," = ");
      iVar5 = t_const_value::get_integer(ptStack_30);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar5);
      poVar10 = std::operator<<(poVar10,";");
      poVar10 = std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    if ((local_32 & 1) == 0) {
      type_name_abi_cxx11_(&local_58,this,(t_type *)value_local);
      poVar10 = std::operator<<((ostream *)psVar7,(string *)&local_58);
      std::operator<<(poVar10," ");
      std::__cxx11::string::~string((string *)&local_58);
    }
    psVar7 = name_local;
    std::__cxx11::string::string((string *)&local_a8,(string *)name);
    render_const_value((string *)local_88,this,(ostream *)psVar7,&local_a8,(t_type *)value_local,
                       ptStack_30);
    std::__cxx11::string::~string((string *)&local_a8);
    std::operator<<((ostream *)name_local,(string *)name);
    poVar10 = std::operator<<((ostream *)name_local," = ");
    poVar10 = std::operator<<(poVar10,(string *)local_88);
    poVar10 = std::operator<<(poVar10,";");
    poVar10 = std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar10,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_88);
  }
  return;
}

Assistant:

void t_dart_generator::print_const_value(std::ostream& out,
                                        string name,
                                        t_type* type,
                                        t_const_value* value,
                                        bool in_static,
                                        bool defval) {
  type = get_true_type(type);

  indent(out);
  if (!defval) {
    out << (in_static ? "var " : "static final ");
  }
  if (type->is_base_type()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    string v2 = render_const_value(out, name, type, value);
    out << name;
    out << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name;
    out << " = " << value->get_integer() << ";" << endl << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    out << type_name(type) << " " << name << " = new " << type_name(type) << "()";
    indent_up();
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, name, field_type, v_iter->second);
      out << endl;
      indent(out) << ".." << v_iter->first->get_string() << " = " << val;
    }
    indent_down();
    out << ";" << endl;
  } else if (type->is_map()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name << " =";
    scope_up(out);

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, name, ktype, v_iter->first);
      string val = render_const_value(out, name, vtype, v_iter->second);
      indent(out) << key << ": " << val << "," << endl;
    }
    scope_down(out, ";" + endl);

    out << endl;
  } else if (type->is_list() || type->is_set()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name << " = ";
    t_type* etype;
    if (type->is_list()) {
      out << "[" << endl;
      etype = ((t_list*)type)->get_elem_type();
    } else {
      out << "new " << type_name(type) << ".from([" << endl;
      etype = ((t_set*)type)->get_elem_type();
    }
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;

    indent_up();
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << val << "," << endl;
    }
    indent_down();

    if (type->is_list()) {
      indent(out) << "];" << endl;
    } else {
      indent(out) << "]);" << endl;
    }

  } else {
    throw "compiler error: no const of type " + type->get_name();
  }
}